

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxInUtxo
          (Psbt *this,uint32_t index,Transaction *tx,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  pointer *ppuVar1;
  uint index_00;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_00;
  bool is_witness;
  int iVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  int ret;
  wally_tx *wally_tx_obj;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tx_txid;
  Txid txid;
  TxOutReference txout;
  Script new_redeem_script;
  int local_14c;
  long local_148;
  void *local_140;
  Script local_138;
  ulong local_100;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  Txid local_d8;
  undefined1 local_b8 [16];
  _func_int *local_a8;
  Script local_a0;
  Script local_68;
  
  local_f8 = key_list;
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x8b9,"SetTxInUtxo");
  local_140 = this->wally_psbt_pointer_;
  lVar5 = *(long *)(*(long *)((long)local_140 + 8) + 8);
  local_100 = (ulong)index;
  lVar6 = local_100 * 0xd0;
  index_00 = *(uint *)(lVar5 + 0x20 + lVar6);
  AbstractTransaction::GetTxid(&local_d8,&tx->super_AbstractTransaction);
  Txid::GetData((ByteData *)local_b8,&local_d8);
  ByteData::GetBytes(&local_f0,(ByteData *)local_b8);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  iVar2 = bcmp((void *)(lVar5 + lVar6),
               local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  key_list_00 = local_f8;
  if (iVar2 == 0) {
    uVar3 = Transaction::GetTxOutCount(tx);
    if (index_00 < uVar3) {
      Transaction::GetTxOut((TxOutReference *)local_b8,tx,index_00);
      Script::Script(&local_68,redeem_script);
      Script::Script(&local_138,&local_a0);
      is_witness = ValidatePsbtUtxo(&local_d8,index_00,&local_138,redeem_script,key_list_00,
                                    &local_68);
      Script::~Script(&local_138);
      local_148 = 0;
      AbstractTransaction::GetHex_abi_cxx11_((string *)&local_138,&tx->super_AbstractTransaction);
      local_14c = wally_tx_from_hex(local_138._vptr_Script,0,&local_148);
      ppuVar1 = &local_138.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_138._vptr_Script != (_func_int **)ppuVar1) {
        operator_delete(local_138._vptr_Script);
      }
      if (local_14c == 0) {
        if ((*(long *)(local_148 + 0x10) != 0) && (*(long *)(local_148 + 0x28) != 0)) {
          lVar5 = local_100 * 0x110;
          local_14c = wally_psbt_input_set_utxo(*(long *)((long)local_140 + 0x10) + lVar5);
          if (local_14c != 0) {
            wally_tx_free(local_148);
            local_138._vptr_Script = (_func_int **)0x21e190;
            local_138.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0x8db;
            local_138.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "SetTxInUtxo";
            logger::log<int&>((CfdSourceLocation *)&local_138,kCfdLogLevelWarning,
                              "wally_psbt_input_set_utxo NG[{}]",&local_14c);
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            local_138._vptr_Script = (_func_int **)ppuVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"psbt add utxo error.","");
            CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_138);
            __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
          }
          iVar2 = 0;
          if (is_witness) {
            local_14c = wally_psbt_input_set_witness_utxo
                                  (*(long *)((long)local_140 + 0x10) + lVar5,
                                   (ulong)index_00 * 0x70 + *(long *)(local_148 + 0x20));
            iVar2 = local_14c;
            if (local_14c != 0) {
              wally_tx_free(local_148);
              local_138._vptr_Script = (_func_int **)0x21e190;
              local_138.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0x8e3;
              local_138.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = "SetTxInUtxo";
              logger::log<int&>((CfdSourceLocation *)&local_138,kCfdLogLevelWarning,
                                "wally_psbt_input_set_witness_utxo NG[{}]",&local_14c);
              pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
              local_138._vptr_Script = (_func_int **)ppuVar1;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"psbt add witness utxo error.","");
              CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_138);
              __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
            }
          }
          local_14c = iVar2;
          wally_tx_free(local_148);
          lVar6 = *(long *)((long)local_140 + 0x10);
          Script::Script(&local_138,&local_a0);
          SetPsbtTxInScriptAndKeyList
                    ((wally_psbt_input *)(lVar6 + lVar5),is_witness,&local_68,key_list_00,&local_138
                    );
          Script::~Script(&local_138);
          Script::~Script(&local_68);
          local_b8._0_8_ = &PTR__AbstractTxOutReference_0025ac70;
          Script::~Script(&local_a0);
          if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          local_d8._vptr_Txid = (_func_int **)&PTR__Txid_0025aa88;
          if (local_d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
        wally_tx_free(local_148);
        local_138._vptr_Script = (_func_int **)0x21e190;
        local_138.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x8d4;
        local_138.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxInUtxo";
        logger::log<>((CfdSourceLocation *)&local_138,kCfdLogLevelWarning,
                      "invalind utxo transaction format.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_138._vptr_Script = (_func_int **)ppuVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"psbt invalid tx error.","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_138);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_138._vptr_Script = (_func_int **)0x21e190;
      local_138.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8cf;
      local_138.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = "SetTxInUtxo";
      logger::log<int&>((CfdSourceLocation *)&local_138,kCfdLogLevelWarning,
                        "wally_tx_from_hex NG[{}]",&local_14c);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_138._vptr_Script = (_func_int **)ppuVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"psbt tx from hex error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_138);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  local_b8._0_8_ = "cfdcore_psbt.cpp";
  local_b8._8_4_ = 0x8c2;
  local_a8 = (_func_int *)0x21eeef;
  logger::log<>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,"unmatch outpoint.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b8._0_8_ = &local_a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"unmatch outpoint.","");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b8);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInUtxo(
    uint32_t index, const Transaction &tx, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint8_t *txhash = psbt_pointer->tx->inputs[index].txhash;
  uint32_t vout = psbt_pointer->tx->inputs[index].index;
  auto txid = tx.GetTxid();
  auto tx_txid = txid.GetData().GetBytes();
  if ((memcmp(txhash, tx_txid.data(), tx_txid.size()) != 0) ||
      (vout >= tx.GetTxOutCount())) {
    warn(CFD_LOG_SOURCE, "unmatch outpoint.");
    throw CfdException(kCfdIllegalArgumentError, "unmatch outpoint.");
  }

  auto txout = tx.GetTxOut(vout);
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, vout, txout.GetLockingScript(), redeem_script, key_list,
      &new_redeem_script);

  struct wally_tx *wally_tx_obj = nullptr;
  int ret = wally_tx_from_hex(tx.GetHex().c_str(), 0, &wally_tx_obj);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt tx from hex error.");
  } else if (
      (wally_tx_obj->num_inputs == 0) || (wally_tx_obj->num_outputs == 0)) {
    wally_tx_free(wally_tx_obj);
    warn(CFD_LOG_SOURCE, "invalind utxo transaction format.");
    throw CfdException(kCfdIllegalArgumentError, "psbt invalid tx error.");
  }

  ret = wally_psbt_input_set_utxo(&psbt_pointer->inputs[index], wally_tx_obj);
  if (ret != WALLY_OK) {
    wally_tx_free(wally_tx_obj);
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add utxo error.");
  }
  if (is_witness) {
    ret = wally_psbt_input_set_witness_utxo(
        &psbt_pointer->inputs[index], &wally_tx_obj->outputs[vout]);
    if (ret != WALLY_OK) {
      wally_tx_free(wally_tx_obj);
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add witness utxo error.");
    }
  }
  wally_tx_free(wally_tx_obj);

  SetPsbtTxInScriptAndKeyList(
      &psbt_pointer->inputs[index], is_witness, new_redeem_script, key_list,
      txout.GetLockingScript());
}